

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O1

bool __thiscall
iutest::detail::FieldMatcher<int_test::syntax_tests::X::*,int>::Check<test::syntax_tests::X*>
          (FieldMatcher<int_test::syntax_tests::X::*,int> *this,X **actual,type **param_2)

{
  AssertionResult local_48;
  EqMatcher<int> local_20;
  
  local_20.m_expected = (int *)(this + 0x10);
  local_20.super_IMatcher._vptr_IMatcher = (_func_int **)&PTR__IMatcher_003b3ce8;
  EqMatcher<int>::operator()
            (&local_48,&local_20,(int *)((long)&(*actual)->a + **(long **)(this + 8)));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.m_message._M_dataplus._M_p != &local_48.m_message.field_2) {
    operator_delete(local_48.m_message._M_dataplus._M_p,
                    local_48.m_message.field_2._M_allocated_capacity + 1);
  }
  return local_48.m_result;
}

Assistant:

bool Check(const U& actual
        , typename detail::enable_if_t< detail::is_pointer<U> >::type*& = detail::enabler::value)
    {
        return static_cast<bool>(CastToMatcher(m_expected)(actual->*m_field));
    }